

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O1

ssize_t add_all_files(int fd,char *parent,char *rel,char *host)

{
  char cVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  tm *ptVar4;
  ulong uVar5;
  ulong nbyte;
  char *__s1;
  ssize_t sVar6;
  stat st;
  char new_rel [256];
  char new_host [1024];
  PsvImgTailer_t tailer;
  stat local_fc8;
  undefined8 local_f38;
  undefined8 uStack_f30;
  uint local_f28;
  undefined4 local_f24;
  ulong local_f20;
  short local_f18;
  short local_f16;
  undefined2 local_f14;
  undefined2 local_f12;
  undefined2 local_f10;
  undefined2 local_f0e;
  undefined4 local_f0c;
  short local_f08;
  short local_f06;
  undefined2 local_f04;
  undefined2 local_f02;
  undefined2 local_f00;
  undefined2 local_efe;
  undefined4 local_efc;
  short local_ef8;
  short local_ef6;
  undefined2 local_ef4;
  undefined2 local_ef2;
  undefined2 local_ef0;
  undefined2 local_eee;
  undefined8 local_eec;
  undefined4 uStack_ee4;
  undefined4 uStack_ee0;
  undefined4 uStack_edc;
  undefined8 uStack_ed8;
  char local_ed0 [256];
  undefined4 local_dd0;
  char local_dcc [1160];
  undefined8 local_944;
  undefined4 local_93c;
  char local_938 [256];
  char local_838 [1032];
  undefined8 local_430 [126];
  undefined8 local_3c;
  undefined4 local_34;
  
  __dirp = opendir(host);
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"cannot open %s\n",host);
LAB_00103814:
    sVar6 = -1;
  }
  else {
    pdVar3 = readdir(__dirp);
    if (pdVar3 == (dirent *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = 0;
      do {
        while ((cVar1 = *rel, cVar1 == '\0' &&
               (iVar2 = strcmp(pdVar3->d_name,"VITA_PATH.TXT"), iVar2 == 0))) {
LAB_001032d5:
          pdVar3 = readdir(__dirp);
          if (pdVar3 == (dirent *)0x0) goto LAB_001037dc;
        }
        __s1 = pdVar3->d_name;
        iVar2 = strcmp(__s1,".");
        if ((iVar2 == 0) || (iVar2 = strcmp(__s1,".."), iVar2 == 0)) goto LAB_001032d5;
        if ((cVar1 != '\0') || (iVar2 = strcmp(__s1,"VITA_DATA.BIN"), iVar2 != 0)) {
          iVar2 = snprintf(local_938,0x100,"%s/%s",rel,__s1);
          if (iVar2 != 0x100) goto LAB_00103335;
          fprintf(_stderr,"path is too long! cannot add %s/%s\n",rel,__s1);
LAB_0010383b:
          closedir(__dirp);
          goto LAB_00103814;
        }
        local_938[0] = '\0';
LAB_00103335:
        snprintf(local_838,0x400,"%s/%s",host,__s1);
        memset(&local_f38,0x78,0x600);
        local_f38 = 0;
        uStack_f30 = 0;
        iVar2 = stat(local_838,&local_fc8);
        if (iVar2 < 0) {
LAB_0010374e:
          fprintf(_stderr,"error getting stat for %s\n",local_838);
          nbyte = 0xffffffffffffffff;
        }
        else {
          local_f28 = (local_fc8.st_mode >> 6 & 2) +
                      (local_fc8.st_mode >> 6 & 4 |
                      (uint)((local_fc8.st_mode & 0xf000) != 0x4000) << 0xc) + 0x1000;
          if ((local_fc8.st_mode & 0x20) != 0) {
            local_f28 = local_f28 | 0x20;
          }
          if ((local_fc8.st_mode & 0x10) != 0) {
            local_f28 = local_f28 | 0x10;
          }
          if ((local_fc8.st_mode & 4) != 0) {
            local_f28 = local_f28 | 0x100;
          }
          if ((local_fc8.st_mode & 2) != 0) {
            local_f28 = local_f28 | 0x80;
          }
          local_f24 = 0;
          local_f20 = local_fc8.st_size;
          ptVar4 = localtime(&local_fc8.st_ctim.tv_sec);
          local_f0e = (undefined2)ptVar4->tm_sec;
          local_f10 = (undefined2)ptVar4->tm_min;
          local_f12 = (undefined2)ptVar4->tm_hour;
          local_f14 = (undefined2)ptVar4->tm_mday;
          local_f16 = (short)ptVar4->tm_mon + 1;
          local_f18 = (short)ptVar4->tm_year + 0x76c;
          local_f0c = 0;
          ptVar4 = localtime(&local_fc8.st_atim.tv_sec);
          local_efe = (undefined2)ptVar4->tm_sec;
          local_f00 = (undefined2)ptVar4->tm_min;
          local_f02 = (undefined2)ptVar4->tm_hour;
          local_f04 = (undefined2)ptVar4->tm_mday;
          local_f06 = (short)ptVar4->tm_mon + 1;
          local_f08 = (short)ptVar4->tm_year + 0x76c;
          local_efc = 0;
          ptVar4 = localtime(&local_fc8.st_mtim.tv_sec);
          local_eee = (undefined2)ptVar4->tm_sec;
          local_ef0 = (undefined2)ptVar4->tm_min;
          local_ef2 = (undefined2)ptVar4->tm_hour;
          local_ef4 = (undefined2)ptVar4->tm_mday;
          local_ef6 = (short)ptVar4->tm_mon + 1;
          local_ef8 = (short)ptVar4->tm_year + 0x76c;
          uStack_edc = 0;
          uStack_ed8 = 0;
          local_eec = 0;
          uStack_ee4 = 0;
          uStack_ee0 = 0;
          if (iVar2 < 0) goto LAB_0010374e;
          strncpy(local_ed0,parent,0x100);
          local_dd0 = 1;
          strncpy(local_dcc,local_938,0x100);
          local_944 = 0x616548664f646e45;
          local_93c = 0xa726564;
          write_block(fd,&local_f38,0x600);
          nbyte = local_f20;
          if ((local_f28 & 0xf000) == 0x2000) {
            printf("packing file %s%s (%llx bytes)...\n",local_ed0,local_dcc,local_f20);
            iVar2 = open(local_838,0);
            if (iVar2 < 0) {
              fprintf(_stderr,"error opening %s\n",local_838);
            }
            else {
              uVar5 = copy_block(fd,iVar2,nbyte);
              if (nbyte <= uVar5) {
                close(iVar2);
                goto LAB_00103645;
              }
              add_all_files_cold_1();
            }
            nbyte = 0xffffffffffffffff;
          }
          else {
            nbyte = 0;
LAB_00103645:
            if ((nbyte & 0x3ff) != 0) {
              iVar2 = 0x401 - (int)(nbyte & 0x3ff);
              do {
                local_fc8.st_dev._0_1_ = 0x2b;
                if (iVar2 == 2) {
                  local_fc8.st_dev._0_1_ = 10;
                }
                write_block(fd,&local_fc8,1);
                iVar2 = iVar2 + -1;
              } while (1 < iVar2);
            }
            memset(local_430,0x7a,0x400);
            local_430[0] = 0;
            local_3c = 0x696154664f646e45;
            local_34 = 0xa72656c;
            write_block(fd,local_430,0x400);
            if ((local_f28 & 0xf000) == 0x1000) {
              printf("packing directory %s%s...\n",local_ed0,local_dcc);
              nbyte = add_all_files(fd,parent,local_938,local_838);
            }
          }
        }
        if ((long)nbyte < 0) goto LAB_0010383b;
        sVar6 = sVar6 + nbyte;
        pdVar3 = readdir(__dirp);
      } while (pdVar3 != (dirent *)0x0);
    }
LAB_001037dc:
    closedir(__dirp);
  }
  return sVar6;
}

Assistant:

static ssize_t add_all_files(int fd, const char *parent, const char *rel, const char *host) {
  char new_rel[256];
  char new_host[MAX_PATH_LEN];
  DIR *dir;
  struct dirent *dent;
  ssize_t fsize, total;

  if ((dir = opendir(host)) == NULL) {
    fprintf(stderr, "cannot open %s\n", host);
    return -1;
  }

  total = 0;
  while ((dent = readdir(dir)) != NULL) {
    if (rel[0] == '\0' && strcmp(dent->d_name, "VITA_PATH.TXT") == 0) {
      // skip this file
      continue;
    }

    if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
      continue;
    }

#ifdef __APPLE__
    if (strcmp(dent->d_name, ".DS_Store") == 0) {
      continue; // ignore annoying OSX specific files
    }
#endif

    if (rel[0] == '\0' && strcmp(dent->d_name, "VITA_DATA.BIN") == 0) { // special file
      new_rel[0] = '\0';
    } else {
      if (snprintf(new_rel, sizeof(new_rel), "%s/%s", rel, dent->d_name) == sizeof(new_rel)) {
        fprintf(stderr, "path is too long! cannot add %s/%s\n", rel, dent->d_name);
        goto err;
      }
    }
    snprintf(new_host, sizeof(new_host), "%s/%s", host, dent->d_name);

    dent = NULL; // so we don't actually reuse it
    // add file/directory to psvimg
    if ((fsize = add_file(fd, parent, new_rel, new_host)) < 0) {
      goto err;
    }
    total += fsize;
  }

  closedir(dir);
  return total;

err:
  closedir(dir);
  return -1;
}